

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.h
# Opt level: O2

void __thiscall BlockFilter::Serialize<DataStream>(BlockFilter *this,DataStream *s)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata8<DataStream>(s,this->m_filter_type);
  base_blob<256U>::Serialize<DataStream>(&(this->m_block_hash).super_base_blob<256U>,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&(this->m_filter).m_encoded)
    ;
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const {
        s << static_cast<uint8_t>(m_filter_type)
          << m_block_hash
          << m_filter.GetEncoded();
    }